

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O1

int swap_axes(map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
              *nodes_map)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_header *p_Var4;
  _Self __tmp;
  _Base_ptr p_Var5;
  
  p_Var3 = (nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(nodes_map->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var4) {
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    p_Var5 = (_Base_ptr)0x0;
    p_Var2 = p_Var3;
    do {
      p_Var1 = p_Var2[1]._M_parent;
      if ((double)p_Var2[1]._M_parent <= (double)p_Var5) {
        p_Var1 = p_Var5;
      }
      p_Var5 = p_Var1;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  for (; (_Rb_tree_header *)p_Var3 != p_Var4;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    p_Var1 = p_Var3[1]._M_parent;
    p_Var3[1]._M_parent = p_Var3[1]._M_left;
    p_Var3[1]._M_left = (_Base_ptr)((double)p_Var5 - (double)p_Var1);
  }
  return 0;
}

Assistant:

int swap_axes(std::map<int, co_ordinates> &nodes_map)
{
    //first determine the offset of the grid.
    std::map<int, co_ordinates>::iterator nodes_it = nodes_map.begin();
    double offset = 0;
    while (nodes_it!=nodes_map.end())
    {
        if (nodes_it->second.co_ord[0]>offset)
            offset = nodes_it->second.co_ord[0];
        nodes_it++;
    }
    //then change [ x1, y1 ] to [y0,( -x0 + offset)]
    nodes_it = nodes_map.begin();
    while (nodes_it!=nodes_map.end())
    {
        double x0 = nodes_it->second.co_ord[0];
        double y0 = nodes_it->second.co_ord[1];
        nodes_it->second.co_ord[0] = y0;
        nodes_it->second.co_ord[1] = -x0+offset;
        nodes_it++;
    }
    return EXIT_SUCCESS;
}